

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O3

void amrex::writeIntData<short,long>(long *data,size_t size,ostream *os,IntDescriptor *id)

{
  int16_t iVar1;
  Ordering OVar2;
  Ordering OVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t sVar4;
  short value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar2 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar3 = IntDescriptor::order(this);
  if (size != 0) {
    sVar4 = 0;
    do {
      uStack_38 = CONCAT26((int16_t)data[sVar4],(undefined6)uStack_38);
      if (OVar2 != OVar3) {
        iVar1 = swapBytes((int16_t)data[sVar4]);
        uStack_38 = CONCAT26(iVar1,(undefined6)uStack_38);
      }
      std::ostream::write((char *)os,(long)&uStack_38 + 6);
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void writeIntData (const From* data, std::size_t size, std::ostream& os,
                       const amrex::IntDescriptor& id)
    {
        To value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            value = static_cast<To>(data[j]);
            if (swapEndian) value = swapBytes(value);
            os.write((char*) &value, sizeof(To));
        }
    }